

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PushStyleColor(ImGuiCol idx,ImU32 col)

{
  ImVec4 *pIVar1;
  int *piVar2;
  int iVar3;
  ImGuiColorMod *pIVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ImGuiContext *pIVar9;
  ImGuiColorMod *__dest;
  int iVar10;
  ImGuiContext *ctx;
  int iVar11;
  ImVec4 *pIVar12;
  
  pIVar9 = GImGui;
  pIVar12 = (GImGui->Style).Colors + idx;
  fVar5 = pIVar12->x;
  fVar6 = pIVar12->y;
  pIVar1 = (GImGui->Style).Colors + idx;
  fVar7 = pIVar1->z;
  fVar8 = pIVar1->w;
  iVar11 = (GImGui->ColorStack).Size;
  iVar3 = (GImGui->ColorStack).Capacity;
  if (iVar11 == iVar3) {
    iVar11 = iVar11 + 1;
    if (iVar3 == 0) {
      iVar10 = 8;
    }
    else {
      iVar10 = iVar3 / 2 + iVar3;
    }
    if (iVar11 < iVar10) {
      iVar11 = iVar10;
    }
    if (iVar3 < iVar11) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar2 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar2 = *piVar2 + 1;
      }
      __dest = (ImGuiColorMod *)(*GImAllocatorAllocFunc)((long)iVar11 * 0x14,GImAllocatorUserData);
      pIVar4 = (pIVar9->ColorStack).Data;
      if (pIVar4 != (ImGuiColorMod *)0x0) {
        memcpy(__dest,pIVar4,(long)(pIVar9->ColorStack).Size * 0x14);
        pIVar4 = (pIVar9->ColorStack).Data;
        if ((pIVar4 != (ImGuiColorMod *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar2 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar2 = *piVar2 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
      }
      (pIVar9->ColorStack).Data = __dest;
      (pIVar9->ColorStack).Capacity = iVar11;
    }
  }
  pIVar4 = (pIVar9->ColorStack).Data;
  iVar11 = (pIVar9->ColorStack).Size;
  pIVar4[iVar11].Col = idx;
  pIVar1 = &pIVar4[iVar11].BackupValue;
  pIVar1->x = fVar5;
  pIVar1->y = fVar6;
  pIVar1->z = fVar7;
  pIVar1->w = fVar8;
  (pIVar9->ColorStack).Size = (pIVar9->ColorStack).Size + 1;
  pIVar12->x = (float)(col & 0xff) * 0.003921569;
  (pIVar9->Style).Colors[idx].y = (float)(col >> 8 & 0xff) * 0.003921569;
  (pIVar9->Style).Colors[idx].z = (float)(col >> 0x10 & 0xff) * 0.003921569;
  (pIVar9->Style).Colors[idx].w = (float)(col >> 0x18) * 0.003921569;
  return;
}

Assistant:

void ImGui::PushStyleColor(ImGuiCol idx, ImU32 col)
{
    ImGuiContext& g = *GImGui;
    ImGuiColorMod backup;
    backup.Col = idx;
    backup.BackupValue = g.Style.Colors[idx];
    g.ColorStack.push_back(backup);
    g.Style.Colors[idx] = ColorConvertU32ToFloat4(col);
}